

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# componententity.cpp
# Opt level: O3

ComponentPtr __thiscall
libcellml::ComponentEntity::takeComponent
          (ComponentEntity *this,string *name,bool searchEncapsulated)

{
  _func_int **pp_Var1;
  EntityImpl *pEVar2;
  const_iterator __position;
  ComponentImpl *this_00;
  char in_CL;
  undefined7 in_register_00000011;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  ulong uVar4;
  Component *__tmp;
  ComponentPtr CVar5;
  ComponentEntity local_58;
  string *local_48;
  ComponentEntity local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  local_48 = (string *)CONCAT71(in_register_00000011,searchEncapsulated);
  (this->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity = (_func_int **)0x0;
  (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl = (EntityImpl *)0x0;
  __position = ComponentEntityImpl::findComponent
                         ((ComponentEntityImpl *)name->_M_string_length,local_48);
  if (__position._M_current == *(shared_ptr<libcellml::Component> **)(name->_M_string_length + 0x58)
     ) {
    _Var3._M_pi = extraout_RDX;
    if ((in_CL != '\0') &&
       (__position._M_current !=
        *(shared_ptr<libcellml::Component> **)(name->_M_string_length + 0x50))) {
      uVar4 = 1;
      this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        component(&local_40,(size_t)name);
        CVar5 = takeComponent(&local_58,
                              (string *)
                              local_40.super_NamedEntity.super_ParentedEntity.super_Entity.
                              _vptr_Entity,SUB81(local_48,0));
        pEVar2 = local_58.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
        pp_Var1 = local_58.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity;
        _Var3 = CVar5.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
        local_58.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
             (_func_int **)0x0;
        local_58.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl = (EntityImpl *)0x0;
        (this->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity = pp_Var1;
        (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl = pEVar2;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          _Var3._M_pi = extraout_RDX_01;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_58.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_58.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
            _Var3._M_pi = extraout_RDX_02;
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
          _Var3._M_pi = extraout_RDX_03;
        }
      } while ((uVar4 < (ulong)(*(long *)(name->_M_string_length + 0x58) -
                                *(long *)(name->_M_string_length + 0x50) >> 4)) &&
              (uVar4 = uVar4 + 1, this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pEVar2,
              pp_Var1 == (_func_int **)0x0));
    }
  }
  else {
    (this->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity =
         (_func_int **)
         ((__position._M_current)->
         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,
               &((__position._M_current)->
                super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
    std::
    vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
    ::_M_erase((vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                *)(name->_M_string_length + 0x50),(iterator)__position._M_current);
    this_00 = Component::pFunc((Component *)
                               (this->super_NamedEntity).super_ParentedEntity.super_Entity.
                               _vptr_Entity);
    ParentedEntity::ParentedEntityImpl::removeParent((ParentedEntityImpl *)this_00);
    _Var3._M_pi = extraout_RDX_00;
  }
  CVar5.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  CVar5.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ComponentPtr)CVar5.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ComponentPtr ComponentEntity::takeComponent(const std::string &name, bool searchEncapsulated)
{
    ComponentPtr foundComponent = nullptr;
    auto result = pFunc()->findComponent(name);
    if (result != pFunc()->mComponents.end()) {
        foundComponent = *result;
        pFunc()->mComponents.erase(result);
        foundComponent->pFunc()->removeParent();
    } else if (searchEncapsulated) {
        for (size_t i = 0; i < componentCount() && !foundComponent; ++i) {
            foundComponent = component(i)->takeComponent(name, searchEncapsulated);
        }
    }

    return foundComponent;
}